

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O0

void __thiscall CTB<UFPC>::FirstScan(CTB<UFPC> *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uchar *puVar8;
  uint *puVar9;
  int local_5c;
  undefined4 local_58;
  int c;
  int prev_state;
  int prob_fol_state;
  uint *img_labels_row_fol;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row_prev;
  uchar *img_row;
  int r;
  int h;
  int w;
  CTB<UFPC> *this_local;
  
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  UFPC::Setup();
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  for (img_row._4_4_ = 0; img_row._4_4_ < iVar2; img_row._4_4_ = img_row._4_4_ + 2) {
    puVar8 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    lVar4 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar9 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    lVar5 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    lVar6 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    c = -1;
    local_58 = 0xffffffff;
    for (local_5c = 0; local_5c < iVar1; local_5c = local_5c + 1) {
      switch(local_58) {
      case 1:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            uVar7 = UFPC::NewLabel();
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = uVar7;
            local_58 = 3;
          }
        }
        else {
          local_58 = 2;
          if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
            if ((img_row._4_4_ + -1 < 0) ||
               ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
              c = 6;
              if ((local_5c + -1 < 0) ||
                 ((img_row._4_4_ + -1 < 0 || (puVar8[(local_5c + -1) - lVar3] == '\0')))) {
                uVar7 = UFPC::NewLabel();
                puVar9[local_5c] = uVar7;
              }
              else {
                puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)(local_5c + -1) * 4 - lVar5));
              }
            }
            else {
              puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5));
              c = 5;
              if (((-1 < local_5c + -1) && (-1 < img_row._4_4_ + -1)) &&
                 (puVar8[(local_5c + -1) - lVar3] != '\0')) {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + -1) * 4 - lVar5)));
              }
            }
          }
          else {
            puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)local_5c * 4 - lVar5));
            c = 4;
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 2:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c + -1];
            local_58 = 7;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          if (c == 4) {
            local_58 = 4;
            puVar9[local_5c] = puVar9[local_5c + -1];
            if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
              if ((img_row._4_4_ + -1 < 0) ||
                 ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
                c = 6;
              }
              else {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5)));
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            puVar9[local_5c] = puVar9[local_5c + -1];
            local_58 = 5;
          }
          else if (c == 6) {
            puVar9[local_5c] = puVar9[local_5c + -1];
            if (((img_row._4_4_ + -1 < 0) || (iVar1 <= local_5c + 1)) ||
               (puVar8[(local_5c + 1) - lVar3] == '\0')) {
              c = 6;
            }
            else {
              UFPC::Merge(puVar9[local_5c],
                          *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 3:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(undefined4 *)((long)puVar9 + (long)local_5c * 4 + lVar6) =
                 *(undefined4 *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6);
            local_58 = 9;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          local_58 = 8;
          if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
            if ((img_row._4_4_ + -1 < 0) ||
               ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
              puVar9[local_5c] = *(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6);
              if ((-1 < local_5c + -1) &&
                 ((-1 < img_row._4_4_ + -1 && (puVar8[(local_5c + -1) - lVar3] != '\0')))) {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + -1) * 4 - lVar5)));
              }
              c = 6;
            }
            else {
              puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5));
              UFPC::Merge(puVar9[local_5c],
                          *(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6));
              if (((-1 < local_5c + -1) && (-1 < img_row._4_4_ + -1)) &&
                 (puVar8[(local_5c + -1) - lVar3] != '\0')) {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + -1) * 4 - lVar5)));
              }
              c = 5;
            }
          }
          else {
            puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)local_5c * 4 - lVar5));
            UFPC::Merge(puVar9[local_5c],*(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6)
                       );
            c = 4;
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 4:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c + -1];
            local_58 = 7;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          if (c == 4) {
            local_58 = 4;
            puVar9[local_5c] = puVar9[local_5c + -1];
            if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
              if ((img_row._4_4_ + -1 < 0) ||
                 ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
                c = 6;
              }
              else {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5)));
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            puVar9[local_5c] = puVar9[local_5c + -1];
            local_58 = 5;
          }
          else if (c == 6) {
            puVar9[local_5c] = puVar9[local_5c + -1];
            if (((img_row._4_4_ + -1 < 0) || (iVar1 <= local_5c + 1)) ||
               (puVar8[(local_5c + 1) - lVar3] == '\0')) {
              c = 6;
            }
            else {
              UFPC::Merge(puVar9[local_5c],
                          *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 5:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c + -1];
            local_58 = 7;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          local_58 = 4;
          puVar9[local_5c] = puVar9[local_5c + -1];
          if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
            if ((img_row._4_4_ + -1 < 0) ||
               ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
              c = 6;
            }
            else {
              UFPC::Merge(puVar9[local_5c],
                          *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          else {
            c = 4;
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 6:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c + -1];
            local_58 = 7;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          if (c == 5) {
            puVar9[local_5c] = puVar9[local_5c + -1];
            local_58 = 5;
          }
          else if (c == 6) {
            puVar9[local_5c] = puVar9[local_5c + -1];
            if (((img_row._4_4_ + -1 < 0) || (iVar1 <= local_5c + 1)) ||
               (puVar8[(local_5c + 1) - lVar3] == '\0')) {
              c = 6;
            }
            else {
              UFPC::Merge(puVar9[local_5c],
                          *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 7:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(undefined4 *)((long)puVar9 + (long)local_5c * 4 + lVar6) =
                 *(undefined4 *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6);
            local_58 = 9;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          local_58 = 8;
          if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
            if ((img_row._4_4_ + -1 < 0) ||
               ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
              puVar9[local_5c] = *(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6);
              if ((-1 < local_5c + -1) &&
                 ((-1 < img_row._4_4_ + -1 && (puVar8[(local_5c + -1) - lVar3] != '\0')))) {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + -1) * 4 - lVar5)));
              }
              c = 6;
            }
            else {
              puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5));
              UFPC::Merge(puVar9[local_5c],
                          *(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6));
              if (((-1 < local_5c + -1) && (-1 < img_row._4_4_ + -1)) &&
                 (puVar8[(local_5c + -1) - lVar3] != '\0')) {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + -1) * 4 - lVar5)));
              }
              c = 5;
            }
          }
          else {
            puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)local_5c * 4 - lVar5));
            UFPC::Merge(puVar9[local_5c],*(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6)
                       );
            c = 4;
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 8:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c + -1];
            local_58 = 7;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          if (c == 4) {
            local_58 = 4;
            puVar9[local_5c] = puVar9[local_5c + -1];
            if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
              if ((img_row._4_4_ + -1 < 0) ||
                 ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
                c = 6;
              }
              else {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5)));
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            puVar9[local_5c] = puVar9[local_5c + -1];
            local_58 = 5;
          }
          else if (c == 6) {
            puVar9[local_5c] = puVar9[local_5c + -1];
            if (((img_row._4_4_ + -1 < 0) || (iVar1 <= local_5c + 1)) ||
               (puVar8[(local_5c + 1) - lVar3] == '\0')) {
              c = 6;
            }
            else {
              UFPC::Merge(puVar9[local_5c],
                          *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 9:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(undefined4 *)((long)puVar9 + (long)local_5c * 4 + lVar6) =
                 *(undefined4 *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6);
            local_58 = 9;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          local_58 = 8;
          if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
            if ((img_row._4_4_ + -1 < 0) ||
               ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
              puVar9[local_5c] = *(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6);
              if ((-1 < local_5c + -1) &&
                 ((-1 < img_row._4_4_ + -1 && (puVar8[(local_5c + -1) - lVar3] != '\0')))) {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + -1) * 4 - lVar5)));
              }
              c = 6;
            }
            else {
              puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5));
              UFPC::Merge(puVar9[local_5c],
                          *(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6));
              if (((-1 < local_5c + -1) && (-1 < img_row._4_4_ + -1)) &&
                 (puVar8[(local_5c + -1) - lVar3] != '\0')) {
                UFPC::Merge(puVar9[local_5c],
                            *(uint *)((long)puVar9 + ((long)(local_5c + -1) * 4 - lVar5)));
              }
              c = 5;
            }
          }
          else {
            puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)local_5c * 4 - lVar5));
            UFPC::Merge(puVar9[local_5c],*(uint *)((long)puVar9 + (long)(local_5c + -1) * 4 + lVar6)
                       );
            c = 4;
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
        break;
      case 0xffffffff:
        if (puVar8[local_5c] == '\0') {
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            uVar7 = UFPC::NewLabel();
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = uVar7;
            local_58 = 7;
          }
          else {
            local_58 = 1;
          }
        }
        else {
          local_58 = 2;
          if ((img_row._4_4_ + -1 < 0) || (puVar8[local_5c - lVar3] == '\0')) {
            if ((img_row._4_4_ + -1 < 0) ||
               ((iVar1 <= local_5c + 1 || (puVar8[(local_5c + 1) - lVar3] == '\0')))) {
              uVar7 = UFPC::NewLabel();
              puVar9[local_5c] = uVar7;
              c = 6;
            }
            else {
              puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)(local_5c + 1) * 4 - lVar5));
              c = 5;
            }
          }
          else {
            puVar9[local_5c] = *(uint *)((long)puVar9 + ((long)local_5c * 4 - lVar5));
            c = 4;
          }
          if ((img_row._4_4_ + 1 < iVar2) && (puVar8[local_5c + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)local_5c * 4 + lVar6) = puVar9[local_5c];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FirstScan() 
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5
    }